

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgdes(fitsfile *fptr,int colnum,LONGLONG rownum,long *length,long *heapaddr,int *status)

{
  int iVar1;
  LONGLONG heapaddrjj;
  LONGLONG lengthjj;
  long local_28;
  long local_20;
  
  iVar1 = ffgdesll(fptr,colnum,rownum,&local_20,&local_28,status);
  if (iVar1 < 1) {
    if (length != (long *)0x0) {
      *length = local_20;
    }
    if (heapaddr != (long *)0x0) {
      *heapaddr = local_28;
    }
  }
  return *status;
}

Assistant:

int ffgdes(fitsfile *fptr, /* I - FITS file pointer                         */
           int colnum,     /* I - column number (1 = 1st column of table)   */
           LONGLONG rownum,    /* I - row number (1 = 1st row of table)         */
           long *length,   /* O - number of elements in the row             */
           long *heapaddr, /* O - heap pointer to the data                  */
           int *status)    /* IO - error status                             */
/*
  get (read) the variable length vector descriptor from the table.
*/
{
    LONGLONG lengthjj, heapaddrjj;
    
    if (ffgdesll(fptr, colnum, rownum, &lengthjj, &heapaddrjj, status) > 0)
        return(*status);

    /* convert the temporary 8-byte values to 4-byte values */
    /* check for overflow */
    if (length) {
        if (lengthjj > LONG_MAX)
	    *status = NUM_OVERFLOW;
	else
            *length = (long) lengthjj;
    }
    
    if (heapaddr) {
        if (heapaddrjj > LONG_MAX)
	    *status = NUM_OVERFLOW;
	else
            *heapaddr = (long) heapaddrjj;
    }
    return(*status);
}